

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

Format * __thiscall
google::protobuf::io::Printer::TokenizeFormat
          (Format *__return_storage_ptr__,Printer *this,string_view format_string,
          PrintOptions *options)

{
  pointer *ppLVar1;
  pointer *ppCVar2;
  undefined2 uVar3;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  iterator __position;
  pointer pLVar4;
  pointer pCVar5;
  size_t sVar6;
  iterator __position_00;
  undefined1 uVar12;
  bool bVar13;
  int iVar14;
  void *pvVar15;
  lts_20250127 *plVar16;
  size_t sVar17;
  pointer pCVar18;
  ulong uVar19;
  char *pcVar20;
  char *extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  lts_20250127 *plVar21;
  char *pcVar22;
  char *__s;
  size_type __rlen;
  lts_20250127 *plVar23;
  lts_20250127 *plVar24;
  bool bVar25;
  string_view sVar26;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  message;
  PrintOptions opts;
  size_type __n;
  const_iterator __begin3;
  const_iterator __begin2;
  basic_string_view<char,_std::char_traits<char>_> local_128;
  char *local_118;
  Printer *local_110;
  lts_20250127 *local_108;
  lts_20250127 *local_100;
  pointer local_f8;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_f0;
  lts_20250127 *local_c0;
  PrintOptions *local_b8;
  char *local_b0;
  Chunk local_a8;
  SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
  local_90;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_60;
  Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>
  local_48;
  
  pcVar20 = format_string._M_str;
  plVar24 = (lts_20250127 *)format_string._M_len;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (__return_storage_ptr__->lines).
  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->lines).
  super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_110 = this;
  local_b8 = options;
  if (options->strip_raw_string_indentation == true) {
    pcVar22 = (char *)0x0;
    plVar23 = (lts_20250127 *)0x0;
    plVar21 = (lts_20250127 *)0x0;
    __s = pcVar20;
    local_108 = plVar24;
LAB_002dece1:
    if (plVar24 == (lts_20250127 *)0x0) {
      bVar25 = false;
    }
    else {
      bVar25 = *__s == '\n';
    }
    plVar24 = plVar24 + -(ulong)bVar25;
    __s = __s + bVar25;
    if (bVar25 != false) {
      if ((plVar24 != (lts_20250127 *)0x0) && (*__s == '#')) goto code_r0x002ded0f;
      goto LAB_002ded5e;
    }
    if (plVar23 == (lts_20250127 *)0x0) {
      pcVar22 = __s;
      plVar23 = plVar24;
    }
    if (plVar23 == (lts_20250127 *)0x0) {
      __return_storage_ptr__->is_raw_string = false;
      plVar21 = (lts_20250127 *)0x0;
      pcVar22 = pcVar20;
      plVar23 = local_108;
    }
    local_48.text_._M_len = (size_t)plVar23;
    local_48.text_._M_str = pcVar22;
    if (local_110->at_start_of_line_ == false) {
      if (plVar23 == (lts_20250127 *)0x0) {
        bVar25 = false;
      }
      else {
        bVar25 = *pcVar22 == '#';
      }
      local_48.text_._M_len = (size_t)local_108;
      local_48.text_._M_str = pcVar20;
      if (!bVar25) {
        local_48.text_._M_len = (size_t)plVar23;
        local_48.text_._M_str = pcVar22;
      }
    }
    goto LAB_002dee06;
  }
  plVar21 = (lts_20250127 *)0x0;
  local_48.text_._M_len = (size_t)plVar24;
  local_48.text_._M_str = pcVar20;
LAB_002dee06:
  local_90.splitter_ = &local_48;
  local_48.delimiter_.c_ = '\n';
  local_90.pos_ = 0;
  local_90.state_ = kInitState;
  local_90.curr_._M_len = 0;
  local_90.curr_._M_str = (char *)0x0;
  local_90.delimiter_.c_ = '\n';
  local_100 = plVar21;
  if (local_48.text_._M_str == (char *)0x0) {
    local_90.state_ = kEndState;
    local_90.pos_ = local_48.text_._M_len;
  }
  else {
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&local_90);
  }
  local_c0 = (lts_20250127 *)local_48.text_._M_len;
  bVar25 = true;
  do {
    if ((local_90.state_ == kEndState) && ((lts_20250127 *)local_90.pos_ == local_c0)) {
      if (__return_storage_ptr__->is_raw_string == true) {
        while ((pLVar4 = (__return_storage_ptr__->lines).
                         super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
               (__return_storage_ptr__->lines).
               super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
               ._M_impl.super__Vector_impl_data._M_start != pLVar4 &&
               (pCVar5 = pLVar4[-1].chunks.
                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                         ._M_impl.super__Vector_impl_data._M_start,
               pCVar5 == pLVar4[-1].chunks.
                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                         ._M_impl.super__Vector_impl_data._M_finish))) {
          (__return_storage_ptr__->lines).
          super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
          ._M_impl.super__Vector_impl_data._M_finish = pLVar4 + -1;
          if (pCVar5 != (pointer)0x0) {
            operator_delete(pCVar5,(long)pLVar4[-1].chunks.
                                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                   (long)pCVar5);
          }
        }
      }
      return __return_storage_ptr__;
    }
    local_128._M_len = local_90.curr_._M_len;
    local_128._M_str = local_90.curr_._M_str;
    if (__return_storage_ptr__->is_raw_string == true) {
      plVar24 = (lts_20250127 *)
                std::basic_string_view<char,_std::char_traits<char>_>::find
                          (&local_128,(local_110->options_).ignored_comment_start._M_str,0,
                           (local_110->options_).ignored_comment_start._M_len);
      if (plVar24 == (lts_20250127 *)0xffffffffffffffff) {
LAB_002deefc:
        bVar13 = true;
      }
      else {
        if (local_128._M_len < plVar24) {
          plVar24 = (lts_20250127 *)local_128._M_len;
        }
        sVar26._M_str = extraout_RDX;
        sVar26._M_len = (size_t)local_128._M_str;
        local_128._M_len = (size_t)plVar24;
        sVar26 = absl::lts_20250127::StripLeadingAsciiWhitespace(plVar24,sVar26);
        if (sVar26._M_len != 0) goto LAB_002deefc;
        bVar25 = false;
        bVar13 = false;
      }
      if (bVar13) goto LAB_002def0c;
    }
    else {
LAB_002def0c:
      sVar17 = local_128._M_len;
      if (bVar25) {
        plVar23 = (lts_20250127 *)0x0;
      }
      else {
        plVar24 = (lts_20250127 *)0x0;
        do {
          plVar21 = (lts_20250127 *)(local_128._M_len + -1);
          pcVar20 = local_128._M_str + 1;
          plVar23 = (lts_20250127 *)sVar17;
          if ((plVar21 == (lts_20250127 *)0xffffffffffffffff) ||
             (plVar23 = plVar24, *local_128._M_str != ' ')) break;
          plVar24 = plVar24 + 1;
          plVar23 = plVar24;
          local_128._M_len = (size_t)plVar21;
          local_128._M_str = pcVar20;
        } while (!bVar25);
      }
      __position._M_current =
           (__return_storage_ptr__->lines).
           super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->lines).
          super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
        ::_M_realloc_insert<>(&__return_storage_ptr__->lines,__position);
      }
      else {
        ((__position._M_current)->chunks).
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__position._M_current)->indent = 0;
        ((__position._M_current)->chunks).
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position._M_current)->chunks).
        super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ppLVar1 = &(__return_storage_ptr__->lines).
                   super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppLVar1 = *ppLVar1 + 1;
      }
      pLVar4 = (__return_storage_ptr__->lines).
               super__Vector_base<google::protobuf::io::Printer::Format::Line,_std::allocator<google::protobuf::io::Printer::Format::Line>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      sVar17 = 0;
      if (local_100 <= plVar23) {
        sVar17 = (long)plVar23 - (long)local_100;
      }
      pLVar4[-1].indent = sVar17;
      local_f0.delimiter_.c_ = (local_110->options_).variable_delimiter;
      uVar19 = (ulong)(byte)local_f0.delimiter_.c_;
      local_60.text_._M_len = local_128._M_len;
      local_60.text_._M_str = local_128._M_str;
      local_f0.pos_ = 0;
      local_f0.state_ = kInitState;
      local_f0.curr_._M_len = 0;
      local_f0.curr_._M_str = (char *)0x0;
      local_f0.splitter_ = &local_60;
      local_60.delimiter_.c_ = local_f0.delimiter_.c_;
      if (local_128._M_str == (char *)0x0) {
        local_f0.state_ = kEndState;
        local_f0.pos_ = local_128._M_len;
      }
      else {
        absl::lts_20250127::strings_internal::
        SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_f0);
        uVar19 = extraout_RDX_00;
      }
      local_f8 = pLVar4 + -1;
      local_108 = (lts_20250127 *)local_60.text_._M_len;
      plVar24 = (lts_20250127 *)0x0;
      bVar25 = false;
      while ((sVar17 = local_f0.curr_._M_len, local_f0.state_ != kEndState ||
             ((lts_20250127 *)local_f0.pos_ != local_108))) {
        pCVar5 = pLVar4[-1].chunks.
                 super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pcVar20 = local_f0.curr_._M_str;
        if ((pLVar4[-1].chunks.
             super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
             ._M_impl.super__Vector_impl_data._M_start == pCVar5) || (bVar25)) {
LAB_002df0f3:
          if (sVar17 != 0 || bVar25 != false) {
            local_a8.text._M_len = sVar17;
            __position_00._M_current =
                 pLVar4[-1].chunks.
                 super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_a8.text._M_str = pcVar20;
            local_a8.is_var = bVar25;
            if (__position_00._M_current ==
                pLVar4[-1].chunks.
                super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::
              vector<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
              ::_M_realloc_insert<google::protobuf::io::Printer::Format::Chunk>
                        (&local_f8->chunks,__position_00,&local_a8);
            }
            else {
              *(ulong *)&(__position_00._M_current)->is_var = CONCAT71(local_a8._17_7_,bVar25);
              ((__position_00._M_current)->text)._M_len = sVar17;
              ((__position_00._M_current)->text)._M_str = pcVar20;
              ppCVar2 = &pLVar4[-1].chunks.
                         super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppCVar2 = *ppCVar2 + 1;
            }
          }
          sVar6 = sVar17 + 2;
          if (bVar25 == false) {
            sVar6 = sVar17;
          }
          plVar24 = plVar24 + sVar6;
          bVar25 = (bool)(bVar25 ^ 1);
        }
        else {
          sVar6 = pCVar5[-1].text._M_len;
          pcVar22 = pCVar5[-1].text._M_str;
          bVar13 = true;
          if (sVar6 == 4) {
            local_118 = local_f0.curr_._M_str;
            iVar14 = bcmp(pcVar22,"_end",4);
            if (iVar14 == 0) {
LAB_002df0d1:
              pCVar5[-1].text._M_len = sVar17 + sVar6 + 1;
              plVar24 = plVar24 + sVar17 + 1;
              bVar13 = false;
              pcVar20 = local_118;
            }
            else {
              bVar13 = true;
              pcVar20 = local_118;
            }
          }
          else if (sVar6 == 6) {
            local_118 = local_f0.curr_._M_str;
            local_b0 = pcVar22;
            iVar14 = bcmp(pcVar22,"_start",6);
            if (iVar14 == 0) goto LAB_002df0d1;
            bVar13 = true;
            pcVar20 = local_118;
          }
          if (bVar13) goto LAB_002df0f3;
        }
        absl::lts_20250127::strings_internal::
        SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
        ::operator++(&local_f0);
        uVar19 = extraout_RDX_01;
      }
      uVar3 = local_b8->loc;
      uVar7 = local_b8->checks_are_debug_only;
      uVar8 = local_b8->use_substitution_map;
      uVar9 = local_b8->use_curly_brace_substitutions;
      uVar10 = local_b8->allow_digit_substitutions;
      uVar11 = local_b8->strip_spaces_around_vars;
      uVar12 = local_b8->strip_raw_string_indentation;
      opts.strip_raw_string_indentation = (bool)uVar12;
      opts.strip_spaces_around_vars = (bool)uVar11;
      opts.allow_digit_substitutions = (bool)uVar10;
      opts.use_curly_brace_substitutions = (bool)uVar9;
      opts.use_substitution_map = (bool)uVar8;
      opts.checks_are_debug_only = (bool)uVar7;
      opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
      _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)
           (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)uVar3;
      local_f0.pos_ = (size_t)local_f8;
      message.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::io::Printer::TokenizeFormat(std::basic_string_view<char,std::char_traits<char>>,google::protobuf::io::Printer::PrintOptions_const&)::__0,std::__cxx11::string>
      ;
      message.ptr_.obj = &local_f0;
      opts.use_annotation_frames = SUB81(uVar19,0);
      Validate(plVar24 == (lts_20250127 *)local_128._M_len,opts,message);
      pCVar5 = pLVar4[-1].chunks.
               super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pLVar4[-1].chunks.
          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_start != pCVar5) {
        do {
          pCVar18 = pCVar5 + -1;
          if ((pCVar5[-1].is_var != false) || ((pCVar18->text)._M_len != 0)) break;
          pLVar4[-1].chunks.
          super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
          ._M_impl.super__Vector_impl_data._M_finish = pCVar18;
          pCVar5 = pCVar18;
        } while (pCVar18 !=
                 pLVar4[-1].chunks.
                 super__Vector_base<google::protobuf::io::Printer::Format::Chunk,_std::allocator<google::protobuf::io::Printer::Format::Chunk>_>
                 ._M_impl.super__Vector_impl_data._M_start);
      }
      bVar25 = false;
    }
    absl::lts_20250127::strings_internal::
    SplitIterator<absl::lts_20250127::strings_internal::Splitter<absl::lts_20250127::ByChar,_absl::lts_20250127::AllowEmpty,_std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator++(&local_90);
  } while( true );
code_r0x002ded0f:
  if (plVar23 == (lts_20250127 *)0x0) {
    plVar23 = plVar24;
    pcVar22 = __s;
  }
  pvVar15 = memchr(__s,10,(size_t)plVar24);
  plVar16 = (lts_20250127 *)((long)pvVar15 - (long)__s);
  if (plVar16 != (lts_20250127 *)0xffffffffffffffff && pvVar15 != (void *)0x0) {
    if (plVar24 < plVar16) {
      std::__throw_out_of_range_fmt
                ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                 plVar16,plVar24);
    }
    __s = __s + (long)plVar16;
    plVar24 = plVar24 + -(long)plVar16;
  }
  if (plVar16 == (lts_20250127 *)0xffffffffffffffff || pvVar15 == (void *)0x0) {
LAB_002ded5e:
    __return_storage_ptr__->is_raw_string = true;
    uVar19 = ~(ulong)plVar24;
    __s = __s + -1;
    plVar21 = (lts_20250127 *)0xffffffffffffffff;
    do {
      if (uVar19 == 0xffffffffffffffff) {
        bVar25 = false;
      }
      else {
        bVar25 = __s[1] == ' ';
      }
      uVar19 = uVar19 + 1;
      __s = __s + 1;
      plVar21 = plVar21 + 1;
    } while (bVar25);
    plVar24 = (lts_20250127 *)-uVar19;
  }
  goto LAB_002dece1;
}

Assistant:

Printer::Format Printer::TokenizeFormat(absl::string_view format_string,
                                        const PrintOptions& options) {
  Format format;
  size_t raw_string_indent = 0;
  if (options.strip_raw_string_indentation) {
    // We are processing a call that looks like
    //
    // p->Emit(R"cc(
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // or
    //
    // p->Emit(R"cc(
    //
    //   class Foo {
    //     int x, y, z;
    //   };
    // )cc");
    //
    // To compute the indent, we need:
    //   1. Iterate over each line.
    //   2. Find the first line that contains non-whitespace characters.
    //   3. Count the number of leading spaces on that line.
    //
    // The following pairs of loops assume the current line is the first line
    // with non-whitespace characters; if we consume all the spaces and
    // then immediately hit a newline, this means this wasn't the right line and
    // we should start over.
    //
    // Note that the very first character *must* be a newline; that is how we
    // detect that this is a multi-line raw string template, and as such this is
    // a while loop, not a do/while loop.

    absl::string_view orig = format_string;
    absl::string_view first_pp_directive;
    while (absl::ConsumePrefix(&format_string, "\n")) {
      // clang-format will think a # at the beginning of the line in a raw
      // string is a preprocessor directive and put it at the start of the line,
      // which throws off indent calculation. Skip past those to find code that
      // is indented more realistically.
      if (absl::StartsWith(format_string, "#")) {
        // We don't want to drop the first #... lines. We just want to skip
        // through here. Remember to allow resetting later.
        if (first_pp_directive.empty()) {
          first_pp_directive = format_string;
        }
        size_t next_newline_index = format_string.find('\n');
        if (next_newline_index != absl::string_view::npos) {
          format_string = format_string.substr(next_newline_index);
          continue;
        }
      }
      raw_string_indent = 0;
      format.is_raw_string = true;
      while (absl::ConsumePrefix(&format_string, " ")) {
        ++raw_string_indent;
      }
    }
    // Reset if we skipped through some #... lines, so that we don't drop them.
    if (!first_pp_directive.empty()) {
      format_string = first_pp_directive;
    }

    // If we consume the entire string, this probably wasn't a raw string and
    // was probably something like a couple of explicit newlines.
    if (format_string.empty()) {
      format_string = orig;
      format.is_raw_string = false;
      raw_string_indent = 0;
    }

    // This means we have a preprocessor directive and we should not have eaten
    // the newline.
    if (!at_start_of_line_ && absl::StartsWith(format_string, "#")) {
      format_string = orig;
    }
  }

  // We now split the remaining format string into lines and discard:
  //   1. A trailing Printer-discarded comment, if this is a raw string.
  //
  //   2. All leading spaces to compute that line's indent.
  //      We do not do this for the first line, so that Emit("  ") works
  //      correctly. We do this *regardless* of whether we are processing
  //      a raw string, because existing non-raw-string calls to cpp::Formatter
  //      rely on this. There is a test that validates this behavior.
  //
  //   3. Set the indent for that line to max(0, line_indent -
  //      raw_string_indent), if this is not a raw string.
  //
  //   4. Trailing empty lines, if we know this is a raw string, except for
  //      a single extra newline at the end.
  //
  // Each line is itself split into chunks along the variable delimiters, e.g.
  // $...$.
  bool is_first = true;
  for (absl::string_view line_text : absl::StrSplit(format_string, '\n')) {
    if (format.is_raw_string) {
      size_t comment_index = line_text.find(options_.ignored_comment_start);
      if (comment_index != absl::string_view::npos) {
        line_text = line_text.substr(0, comment_index);
        if (absl::StripLeadingAsciiWhitespace(line_text).empty()) {
          // If the first line is part of an ignored comment, consider that a
          // first line as well.
          is_first = false;
          continue;
        }
      }
    }

    size_t line_indent = 0;
    while (!is_first && absl::ConsumePrefix(&line_text, " ")) {
      ++line_indent;
    }
    is_first = false;

    format.lines.emplace_back();
    auto& line = format.lines.back();
    line.indent =
        line_indent > raw_string_indent ? line_indent - raw_string_indent : 0;

    bool is_var = false;
    size_t total_len = 0;
    for (absl::string_view chunk :
         absl::StrSplit(line_text, options_.variable_delimiter)) {
      // The special _start and _end variables should actually glom the next
      // chunk into themselves, so as to be of the form _start$foo and _end$foo.
      if (!line.chunks.empty() && !is_var) {
        auto& prev = line.chunks.back();
        if (prev.text == "_start" || prev.text == "_end") {
          // The +1 below is to account for the $ in between them.
          // This string is safe, because prev.text and chunk are contiguous
          // by construction.
          prev.text = absl::string_view(prev.text.data(),
                                        prev.text.size() + 1 + chunk.size());

          // Account for the foo$ part of $_start$foo$.
          total_len += chunk.size() + 1;
          continue;
        }
      }

      if (is_var || !chunk.empty()) {
        line.chunks.push_back(Format::Chunk{chunk, is_var});
      }

      total_len += chunk.size();
      if (is_var) {
        // This accounts for the $s around a variable.
        total_len += 2;
      }

      is_var = !is_var;
    }

    // To ensure there are no unclosed $...$, we check that the computed length
    // above equals the actual length of the string. If it's off, that means
    // that there are missing or extra $ characters.
    Validate(total_len == line_text.size(), options, [&line] {
      if (line.chunks.empty()) {
        return std::string("wrong number of variable delimiters");
      }

      return absl::StrFormat("unclosed variable name: `%s`",
                             absl::CHexEscape(line.chunks.back().text));
    });

    // Trim any empty, non-variable chunks.
    while (!line.chunks.empty()) {
      auto& last = line.chunks.back();
      if (last.is_var || !last.text.empty()) {
        break;
      }

      line.chunks.pop_back();
    }
  }

  // Discard any trailing newlines (i.e., lines which contain no chunks.)
  if (format.is_raw_string) {
    while (!format.lines.empty() && format.lines.back().chunks.empty()) {
      format.lines.pop_back();
    }
  }

#if 0  // Use this to aid debugging tokenization.
  LOG(INFO) << "--- " << format.lines.size() << " lines";
  for (size_t i = 0; i < format.lines.size(); ++i) {
    const auto& line = format.lines[i];

    auto log_line = absl::StrFormat("[\" \" x %d]", line.indent);
    for (const auto& chunk : line.chunks) {
      absl::StrAppendFormat(&log_line, " %s\"%s\"", chunk.is_var ? "$" : "",
                            absl::CHexEscape(chunk.text));
    }
    LOG(INFO) << log_line;
  }
  LOG(INFO) << "---";
#endif

  return format;
}